

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMpsFF.cpp
# Opt level: O3

HighsInt __thiscall
free_format_parser::HMpsFF::fillMatrix(HMpsFF *this,HighsLogOptions *log_options)

{
  vector<int,_std::allocator<int>_> *this_00;
  pointer ptVar1;
  pointer pdVar2;
  pointer piVar3;
  pointer piVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  pointer ptVar11;
  long lVar12;
  int iVar13;
  size_type __new_size;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  int iVar17;
  value_type_conflict2 local_34;
  
  ptVar1 = (this->entries).
           super__Vector_base<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ptVar11 = (this->entries).
            super__Vector_base<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  __new_size = (long)ptVar11 - (long)ptVar1 >> 4;
  uVar10 = 1;
  if (__new_size == (long)this->num_nz) {
    std::vector<double,_std::allocator<double>_>::resize(&this->a_value,__new_size);
    std::vector<int,_std::allocator<int>_>::resize(&this->a_index,(long)this->num_nz);
    this_00 = &this->a_start;
    local_34 = 0;
    std::vector<int,_std::allocator<int>_>::_M_fill_assign
              (this_00,(long)this->num_col + 1,&local_34);
    if (ptVar11 == ptVar1) {
      uVar10 = 0;
    }
    else {
      ptVar1 = (this->entries).
               super__Vector_base<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      ptVar11 = (this->entries).
                super__Vector_base<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      uVar7 = (long)ptVar11 - (long)ptVar1 >> 4;
      if (ptVar11 == ptVar1) {
        uVar9 = uVar7;
        uVar14 = 0;
LAB_001f3cc7:
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   uVar14,uVar9);
      }
      iVar13 = *(int *)&(ptVar1->super__Tuple_impl<0UL,_int,_int,_double>).
                        super__Tuple_impl<1UL,_int,_double>.field_0xc;
      iVar17 = this->num_nz;
      if (0 < iVar17) {
        pdVar2 = (this->a_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar15 = (long)(this->a_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)pdVar2 >> 3;
        piVar3 = (this->a_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar6 = (long)(this->a_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)piVar3 >> 2;
        piVar4 = (this->a_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar5 = (long)(this->a_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)piVar4 >> 2;
        uVar16 = 0;
        do {
          uVar9 = uVar7;
          uVar14 = uVar7;
          if ((uVar16 == uVar7) || (uVar9 = uVar15, uVar14 = uVar15, uVar16 == uVar15))
          goto LAB_001f3cc7;
          ptVar11 = ptVar1 + uVar16;
          pdVar2[uVar16] =
               (ptVar11->super__Tuple_impl<0UL,_int,_int,_double>).
               super__Tuple_impl<1UL,_int,_double>.super__Tuple_impl<2UL,_double>.
               super__Head_base<2UL,_double,_false>._M_head_impl;
          uVar9 = uVar6;
          uVar14 = uVar6;
          if (uVar16 == uVar6) goto LAB_001f3cc7;
          piVar3[uVar16] =
               (ptVar11->super__Tuple_impl<0UL,_int,_int,_double>).
               super__Tuple_impl<1UL,_int,_double>.super__Head_base<1UL,_int,_false>._M_head_impl;
          iVar17 = *(int *)&(ptVar11->super__Tuple_impl<0UL,_int,_int,_double>).
                            super__Tuple_impl<1UL,_int,_double>.field_0xc;
          uVar10 = iVar17 - iVar13;
          if (uVar10 != 0) {
            if (this->num_col <= iVar17) {
              return 1;
            }
            uVar14 = (ulong)iVar17;
            uVar9 = uVar5;
            if (uVar5 <= uVar14) goto LAB_001f3cc7;
            piVar4[uVar14] = (int)uVar16;
            iVar13 = iVar17;
            if (1 < (int)uVar10) {
              lVar12 = (ulong)uVar10 - 1;
              do {
                uVar14 = uVar14 - 1;
                if (uVar5 <= uVar14) goto LAB_001f3cc7;
                piVar4[uVar14] = (int)uVar16;
                lVar12 = lVar12 + -1;
              } while (lVar12 != 0);
            }
          }
          uVar16 = uVar16 + 1;
          iVar17 = this->num_nz;
        } while ((long)uVar16 < (long)iVar17);
      }
      uVar10 = this->num_col;
      if (iVar13 < (int)uVar10) {
        piVar3 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        lVar8 = (long)iVar13;
        do {
          piVar3[lVar8 + 1] = iVar17;
          lVar8 = lVar8 + 1;
          uVar10 = this->num_col;
          lVar12 = (long)(int)uVar10;
        } while (lVar8 < lVar12);
      }
      else {
        lVar12 = (long)(int)uVar10;
      }
      piVar3 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar9 = 0;
      uVar7 = (ulong)uVar10;
      if ((int)uVar10 < 1) {
        uVar7 = uVar9;
      }
      do {
        uVar14 = uVar9;
        if (uVar7 == uVar14) goto LAB_001f3ca3;
        uVar9 = uVar14 + 1;
      } while (piVar3[uVar14] <= piVar3[uVar14 + 1]);
      highsLogUser(log_options,kError,"Non-monotonic starts in MPS file reader\n");
LAB_001f3ca3:
      uVar10 = (uint)((long)uVar14 < lVar12);
    }
  }
  return uVar10;
}

Assistant:

HighsInt HMpsFF::fillMatrix(const HighsLogOptions& log_options) {
  size_t num_entries = entries.size();
  if (num_entries != static_cast<size_t>(num_nz)) return 1;

  a_value.resize(num_nz);
  a_index.resize(num_nz);
  a_start.assign(num_col + 1, 0);
  // Nothing to do if there are no entries in the matrix
  if (!num_entries) return 0;

  HighsInt newColIndex = std::get<0>(entries.at(0));

  for (HighsInt k = 0; k < num_nz; k++) {
    a_value.at(k) = std::get<2>(entries.at(k));
    a_index.at(k) = std::get<1>(entries.at(k));

    if (std::get<0>(entries.at(k)) != newColIndex) {
      HighsInt nEmptyCols = std::get<0>(entries.at(k)) - newColIndex;
      newColIndex = std::get<0>(entries.at(k));
      if (newColIndex >= num_col) return 1;

      a_start.at(newColIndex) = k;
      for (HighsInt i = 1; i < nEmptyCols; i++) {
        a_start.at(newColIndex - i) = k;
      }
    }
  }

  for (HighsInt col = newColIndex + 1; col <= num_col; col++)
    a_start[col] = num_nz;

  for (HighsInt i = 0; i < num_col; i++) {
    if (a_start[i] > a_start[i + 1]) {
      highsLogUser(log_options, HighsLogType::kError,
                   "Non-monotonic starts in MPS file reader\n");
      return 1;
    }
  }

  return 0;
}